

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printLogicalImm32(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  uint64_t uVar4;
  int64_t Val;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(op);
  uVar4 = AArch64_AM_decodeLogicalImmediate((long)(int)iVar3,0x20);
  printUInt32Bang(O,(uint32_t)uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(long *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
         (long)(int)(uint32_t)uVar4;
    pcVar2 = MI->flat_insn->detail;
    (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
  }
  return;
}

Assistant:

static void printLogicalImm32(MCInst *MI, unsigned OpNum, SStream *O)
{
	int64_t Val = (int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	Val = AArch64_AM_decodeLogicalImmediate(Val, 32);
	printUInt32Bang(O, (int)Val);

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}